

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O3

void __thiscall
Diligent::PipelineResourceLayoutDescX::PipelineResourceLayoutDescX
          (PipelineResourceLayoutDescX *this,PipelineResourceLayoutDescX *param_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer pSVar4;
  Uint32 UVar5;
  SHADER_RESOURCE_VARIABLE_TYPE SVar6;
  undefined3 uVar7;
  SHADER_TYPE SVar8;
  Uint32 UVar9;
  
  (this->super_PipelineResourceLayoutDesc).ImmutableSamplers =
       (param_1->super_PipelineResourceLayoutDesc).ImmutableSamplers;
  SVar6 = (param_1->super_PipelineResourceLayoutDesc).DefaultVariableType;
  uVar7 = *(undefined3 *)&(param_1->super_PipelineResourceLayoutDesc).field_0x1;
  SVar8 = (param_1->super_PipelineResourceLayoutDesc).DefaultVariableMergeStages;
  UVar9 = (param_1->super_PipelineResourceLayoutDesc).NumVariables;
  uVar2 = *(undefined4 *)&(param_1->super_PipelineResourceLayoutDesc).field_0xc;
  UVar5 = (param_1->super_PipelineResourceLayoutDesc).NumImmutableSamplers;
  uVar1 = *(undefined4 *)&(param_1->super_PipelineResourceLayoutDesc).field_0x1c;
  (this->super_PipelineResourceLayoutDesc).Variables =
       (param_1->super_PipelineResourceLayoutDesc).Variables;
  (this->super_PipelineResourceLayoutDesc).NumImmutableSamplers = UVar5;
  *(undefined4 *)&(this->super_PipelineResourceLayoutDesc).field_0x1c = uVar1;
  (this->super_PipelineResourceLayoutDesc).DefaultVariableType = SVar6;
  *(undefined3 *)&(this->super_PipelineResourceLayoutDesc).field_0x1 = uVar7;
  (this->super_PipelineResourceLayoutDesc).DefaultVariableMergeStages = SVar8;
  (this->super_PipelineResourceLayoutDesc).NumVariables = UVar9;
  *(undefined4 *)&(this->super_PipelineResourceLayoutDesc).field_0xc = uVar2;
  pSVar4 = (param_1->VarCopy).
           super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->VarCopy).
  super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->VarCopy).
       super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->VarCopy).
  super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar4;
  (this->VarCopy).
  super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->VarCopy).
       super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->VarCopy).
  super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->VarCopy).
  super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->VarCopy).
  super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar1 = *(undefined4 *)
           ((long)&(param_1->ImtblSamCopy).
                   super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start + 4);
  uVar2 = *(undefined4 *)
           &(param_1->ImtblSamCopy).
            super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = *(undefined4 *)
           ((long)&(param_1->ImtblSamCopy).
                   super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 4);
  *(undefined4 *)
   &(this->ImtblSamCopy).
    super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
    ._M_impl.super__Vector_impl_data._M_start =
       *(undefined4 *)
        &(param_1->ImtblSamCopy).
         super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
         ._M_impl.super__Vector_impl_data._M_start;
  *(undefined4 *)
   ((long)&(this->ImtblSamCopy).
           super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = uVar1;
  *(undefined4 *)
   &(this->ImtblSamCopy).
    super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
    ._M_impl.super__Vector_impl_data._M_finish = uVar2;
  *(undefined4 *)
   ((long)&(this->ImtblSamCopy).
           super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = uVar3;
  (this->ImtblSamCopy).
  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->ImtblSamCopy).
       super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->ImtblSamCopy).
  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->ImtblSamCopy).
  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->ImtblSamCopy).
  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->StringPool)._M_h,&param_1->StringPool);
  return;
}

Assistant:

PipelineResourceLayoutDescX(PipelineResourceLayoutDescX&&) noexcept = default;